

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

void __thiscall S2Polyline::S2Polyline(S2Polyline *this,S2Polyline *src)

{
  int iVar1;
  undefined1 auVar2 [16];
  size_t __n;
  Vector3<double> *__s;
  ulong uVar3;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polyline_002bccd8;
  iVar1 = src->num_vertices_;
  this->num_vertices_ = iVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar1;
  __n = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar3 = __n;
  }
  __s = (Vector3<double> *)operator_new__(uVar3);
  if (iVar1 != 0) {
    memset(__s,0,((__n - 0x18) / 0x18) * 0x18 + 0x18);
    (this->vertices_)._M_t.
    super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
    super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = __s;
    memmove(__s,(src->vertices_)._M_t.
                super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t
                .super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
                super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,__n);
    return;
  }
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = __s;
  return;
}

Assistant:

S2Polyline::S2Polyline(const S2Polyline& src)
  : num_vertices_(src.num_vertices_),
    vertices_(new S2Point[num_vertices_]) {
  std::copy(&src.vertices_[0], &src.vertices_[num_vertices_], &vertices_[0]);
}